

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::ZeroObjColSingletonPS
          (ZeroObjColSingletonPS *this,ZeroObjColSingletonPS *old)

{
  int iVar1;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ZeroObjColSingletonPS_00337e70;
  iVar1 = old->m_i;
  this->m_j = old->m_j;
  this->m_i = iVar1;
  this->m_old_j = old->m_old_j;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_lhs).m_backend,&(old->m_lhs).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_rhs).m_backend,&(old->m_rhs).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_lower).m_backend,&(old->m_lower).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_upper).m_backend,&(old->m_upper).m_backend);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->m_row,&old->m_row);
  return;
}

Assistant:

ZeroObjColSingletonPS(const ZeroObjColSingletonPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_lower(old.m_lower)
         , m_upper(old.m_upper)
         , m_row(old.m_row)
      {}